

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O1

vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
* __thiscall
boost::ext::ut::v1_1_8::utility::
split<std::basic_string_view<char,std::char_traits<char>>,char_const*>
          (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           *__return_storage_ptr__,utility *this,
          basic_string_view<char,_std::char_traits<char>_> input,char *delim)

{
  pointer *ppbVar1;
  iterator __position;
  pointer pbVar2;
  size_t __n;
  size_type sVar3;
  ulong uVar4;
  undefined8 uVar5;
  utility *__pos;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  local_40._M_str = (char *)input._M_len;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __pos = (utility *)0x0;
  local_40._M_len = (size_t)this;
  do {
    if (local_40._M_len <= __pos) {
      return __return_storage_ptr__;
    }
    __n = strlen(input._M_str);
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                      (&local_40,input._M_str,(size_type)__pos,__n);
    uVar4 = sVar3 - (long)__pos;
    if (uVar4 != 0) {
      if (local_40._M_len < __pos) {
        uVar5 = std::__throw_out_of_range_fmt
                          ("%s: __pos (which is %zu) > __size (which is %zu)",
                           "basic_string_view::substr",__pos);
        pbVar2 = (__return_storage_ptr__->
                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (pbVar2 != (pointer)0x0) {
          operator_delete(pbVar2,(long)(__return_storage_ptr__->
                                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pbVar2);
        }
        _Unwind_Resume(uVar5);
      }
      local_50._M_len = uVar4;
      if (local_40._M_len - (long)__pos < uVar4) {
        local_50._M_len = local_40._M_len - (long)__pos;
      }
      local_50._M_str = local_40._M_str + (long)__pos;
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
                  ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)__return_storage_ptr__,__position,&local_50);
      }
      else {
        (__position._M_current)->_M_len = local_50._M_len;
        (__position._M_current)->_M_str = local_50._M_str;
        ppbVar1 = &(__return_storage_ptr__->
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar1 = *ppbVar1 + 1;
      }
    }
    __pos = (utility *)(sVar3 + 1);
  } while (__pos != (utility *)0x0);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] inline auto split(T input, TDelim delim) -> std::vector<T> {
    std::vector<T> output{};
    std::size_t first{};
    while (first < std::size(input)) {
      const auto second = input.find_first_of(delim, first);
      if (first != second) {
        output.emplace_back(input.substr(first, second - first));
      }
      if (second == T::npos) {
        break;
      }
      first = second + 1;
    }
    return output;
  }